

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

void build_colors(chunk_conflict *c,int *colors,int *counts,_Bool *stairs,_Bool diagonal)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc_conflict lVar5;
  queue *q;
  void *__s;
  uintptr_t uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int x;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  loc local_70;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  int *local_58;
  _Bool *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_68 = c->height;
  if (0 < (int)local_68) {
    iVar7 = c->width;
    local_38 = (ulong)diagonal * 4 + 4;
    iVar8 = 1;
    uVar12 = 0;
    local_64 = iVar7;
    local_58 = counts;
    local_50 = stairs;
    do {
      if (0 < iVar7) {
        x = 0;
        local_40 = uVar12;
        do {
          lVar5 = loc(x,(int)uVar12);
          wVar2 = ignore_point(c,colors,lVar5);
          if (wVar2 == L'\0') {
            local_60 = x;
            lVar5 = loc(x,(int)uVar12);
            wVar2 = c->width;
            sVar10 = (long)c->height * (long)wVar2;
            q = q_new(sVar10);
            __s = mem_zalloc(sVar10 * 4);
            if (0 < (int)sVar10) {
              memset(__s,0,(sVar10 & 0xffffffff) << 2);
            }
            wVar3 = grid_to_i(lVar5,wVar2);
            q_push(q,(long)wVar3);
            local_48 = (long)iVar8;
            local_58[local_48] = 0;
            local_5c = iVar8;
            while (sVar10 = q_len(q), sVar10 != 0) {
              uVar6 = q_pop(q);
              i_to_grid((wchar_t)uVar6,wVar2,(loc_conflict *)&local_70);
              wVar3 = ignore_point(c,colors,(loc_conflict)local_70);
              if (wVar3 == L'\0') {
                colors[(wchar_t)uVar6] = (int)local_48;
                local_58[local_48] = local_58[local_48] + 1;
                if ((local_50 != (_Bool *)0x0) && (_Var1 = square_isstairs(c,local_70), _Var1)) {
                  local_50[local_48] = true;
                }
                lVar9 = 0;
                do {
                  lVar5 = loc_sum((loc_conflict)local_70,(loc_conflict)ddgrid_ddd[lVar9]);
                  wVar3 = grid_to_i(lVar5,wVar2);
                  wVar4 = ignore_point(c,colors,lVar5);
                  if ((wVar4 == L'\0') &&
                     (uVar6 = (uintptr_t)wVar3, *(int *)((long)__s + uVar6 * 4) == 0)) {
                    q_push(q,uVar6);
                    *(undefined4 *)((long)__s + uVar6 * 4) = 1;
                  }
                  lVar9 = lVar9 + 1;
                } while (local_38 != lVar9);
              }
            }
            mem_free(__s);
            q_free(q);
            iVar8 = local_5c + 1;
            uVar12 = local_40;
            iVar7 = local_64;
            x = local_60;
          }
          x = x + 1;
        } while (x != iVar7);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 != local_68);
  }
  return;
}

Assistant:

static void build_colors(struct chunk *c, int colors[], int counts[],
		bool *stairs, bool diagonal)
{
	int y, x;
	int h = c->height;
	int w = c->width;
	int color = 1;

	for (y = 0; y < h; y++) {
		for (x = 0; x < w; x++) {
			if (ignore_point(c, colors, loc(x, y))) continue;
			build_color_point(c, colors, counts, stairs,
				loc(x, y), color, diagonal);
			color++;
		}
	}
}